

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  Profile profile;
  SessionB sessionB;
  Profile copy;
  SessionB sessionBAlias;
  Id id;
  Session session;
  Session sessionAlias;
  
  std::__cxx11::string::string((string *)&session,"Alice",(allocator *)&sessionAlias);
  HG::Profile::Profile(&profile,(string *)&session,0xb);
  std::__cxx11::string::~string((string *)&session);
  HG::Profile::print(&profile);
  HG::Profile::setAge(&profile,0xc);
  HG::Profile::Profile(&copy,&profile);
  HG::Profile::print(&copy);
  HG::Id::Id(&id);
  HG::Id::applyLogic(&id);
  sessionAlias.handle = (Session_t *)0x0;
  sessionAlias.cb.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  sessionAlias.cb.super__Function_base._M_manager =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nsergey82[P]hourglass/app/main.cpp:22:13)>
       ::_M_invoke;
  sessionAlias.cb.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nsergey82[P]hourglass/app/main.cpp:22:13)>
       ::_M_manager;
  HG::Session::Session(&session,(SessionCB *)&sessionAlias);
  std::_Function_base::~_Function_base((_Function_base *)&sessionAlias);
  HG::Session::Session(&sessionAlias,&session);
  HG::Session::print(&session,(ostream *)&std::cout);
  HG::Session::call(&sessionAlias);
  HG::SessionB::SessionB(&sessionB);
  HG::SessionB::SessionB(&sessionBAlias,&sessionB);
  std::operator<<((ostream *)&std::cout,"======\n");
  HG::SessionB::~SessionB(&sessionBAlias);
  HG::SessionB::~SessionB(&sessionB);
  HG::Session::~Session(&sessionAlias);
  HG::Session::~Session(&session);
  HG::Profile::~Profile(&copy);
  HG::Profile::~Profile(&profile);
  return 0;
}

Assistant:

int main(int, char**) {
    HG::Profile profile("Alice", 11);
    profile.print();
    profile.setAge(12);
    HG::Profile copy(profile);
    copy.print();


    HG::Id id;
    id.applyLogic();

    // this is your std::function<void (int)>
    auto cb =
            [](int a){ std::cout << "Library gave " << a << " to callback\n"; };

    HG::Session session(cb);
    HG::Session sessionAlias(session);
    session.print(std::cout);
    sessionAlias.call();

    // `sessionAlias.call()` conceptually the same as:
    //Session_cb_t *cbptr = reinterpret_cast<Session_cb_t*>(&cb);
    //SessionHandlerCallerPtr  caller = &dispatchAny<decltype(cb), Session_cb_t>;
    //caller(cbptr, 42);

    HG::SessionB sessionB;
    HG::SessionB sessionBAlias(sessionB);

    std::cout << "======\n";

}